

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O2

int s2_semi_mgau_frame_eval
              (s2_semi_mgau_t *s,ascr_t *ascr,fast_gmm_t *fgmm,mfcc_t **featbuf,int32 frame)

{
  mfcc_t *pmVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  mfcc_t *feat;
  vqFeature_t *pvVar6;
  vqFeature_t vVar7;
  int32 *piVar8;
  uint8 *puVar9;
  uint8 **ppuVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  uint8 *puVar14;
  uint8 *puVar15;
  uint8 *puVar16;
  void *pvVar17;
  mfcc_t *pmVar18;
  long lVar19;
  kd_tree_node_t *pkVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  mfcc_t *pmVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  mfcc_t *pmVar28;
  int iVar29;
  vqFeature_t *pvVar30;
  long lVar31;
  mfcc_t *pmVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  int iVar36;
  mfcc_t *pmVar37;
  mfcc_t mVar38;
  float fVar39;
  
  memset(ascr->senscr,0,(long)s->n_sen << 2);
  iVar23 = frame % s->n_topn_hist;
  lVar22 = (long)iVar23;
  s->f = s->topn_hist[lVar22];
  lVar25 = 0;
  do {
    if (s->n_feat <= lVar25) {
      return 0;
    }
    if (s->frame_idx <= frame) {
      lVar19 = lVar22;
      if (iVar23 == 0) {
        lVar19 = (long)s->n_topn_hist;
      }
      memcpy(s->f[lVar25],s->topn_hist[lVar19 + -1][lVar25],(long)s->max_topn << 3);
      feat = featbuf[lVar25];
      pvVar6 = s->f[lVar25];
      iVar36 = s->veclen[lVar25];
      iVar29 = 0;
      if (0 < iVar36) {
        iVar29 = iVar36;
      }
      for (lVar19 = 0; lVar31 = (long)s->max_topn, lVar19 < lVar31; lVar19 = lVar19 + 1) {
        mVar38 = s->dets[lVar25][pvVar6[lVar19].codeword];
        lVar31 = (long)(pvVar6[lVar19].codeword * iVar36);
        for (lVar34 = 0; iVar29 != (int)lVar34; lVar34 = lVar34 + 1) {
          fVar39 = (float)feat[lVar34] - (float)s->means[lVar25][lVar31 + lVar34];
          mVar38 = (mfcc_t)((float)mVar38 -
                           fVar39 * fVar39 * (float)s->vars[lVar25][lVar31 + lVar34]);
        }
        pvVar6[lVar19].score = (int)(float)mVar38;
        if (lVar19 != 0) {
          vVar7 = pvVar6[lVar19];
          for (lVar31 = lVar19; 0 < lVar31; lVar31 = lVar31 + -1) {
            if ((int)(float)mVar38 <= pvVar6[lVar31 + -1].score) goto LAB_00118a7e;
            pvVar6[lVar31] = pvVar6[lVar31 + -1];
          }
          lVar31 = 0;
LAB_00118a7e:
          pvVar6[(int)lVar31] = vVar7;
        }
      }
      if (frame % (int)s->ds_ratio == 0) {
        if (s->kdtrees == (kd_tree_t **)0x0) {
          pvVar6 = s->f[lVar25];
          pmVar37 = s->means[lVar25];
          pmVar28 = s->vars[lVar25];
          pmVar18 = s->dets[lVar25];
          sVar3 = s->n_density;
          uVar27 = s->veclen[lVar25];
          uVar35 = 0;
          pmVar24 = pmVar18;
          if (0 < (int)uVar27) {
            uVar35 = (ulong)uVar27;
          }
LAB_00119222:
          if (pmVar24 < pmVar18 + sVar3) {
            mVar38 = *pmVar24;
            pmVar1 = pmVar28 + uVar35;
            pmVar32 = pmVar37 + uVar35;
            lVar19 = 0;
            for (lVar34 = 0; (int)uVar35 != (int)lVar34; lVar34 = lVar34 + 1) {
              if ((float)mVar38 < (float)pvVar6[lVar31 + -1].score) {
                pmVar32 = (mfcc_t *)((long)pmVar37 + (((int)uVar27 - lVar34) * 4 - lVar19));
                pmVar28 = (mfcc_t *)((long)pmVar28 + (((int)uVar27 - lVar34) * 4 - lVar19));
                goto LAB_001192f4;
              }
              mVar38 = (mfcc_t)((float)mVar38 -
                               ((float)feat[lVar34] - (float)pmVar37[lVar34]) *
                               ((float)feat[lVar34] - (float)pmVar37[lVar34]) *
                               (float)pmVar28[lVar34]);
              lVar19 = lVar19 + -4;
            }
            iVar36 = (int)(float)mVar38;
            pmVar28 = pmVar1;
            if (pvVar6[lVar31 + -1].score <= iVar36) {
              uVar5 = s->max_topn;
              if ((short)uVar5 < 1) {
                uVar5 = 0;
              }
              uVar33 = 0;
              do {
                iVar29 = (int)((ulong)((long)pmVar24 - (long)pmVar18) >> 2);
                pvVar30 = pvVar6 + lVar31 + -2;
                if (uVar5 == uVar33) goto LAB_001192d7;
                pvVar30 = pvVar6 + uVar33;
                uVar33 = uVar33 + 1;
              } while (pvVar30->codeword != iVar29);
            }
            goto LAB_001192f4;
          }
          goto LAB_00118aa2;
        }
        pkVar20 = eval_kd_tree(s->kdtrees[lVar25],feat,s->kd_maxdepth);
        uVar27 = s->kd_maxbbi;
        uVar5 = pkVar20->n_bbi;
        uVar21 = (uint)uVar5;
        if ((int)uVar27 < (int)(uint)uVar5) {
          uVar21 = uVar27;
        }
        if (uVar27 == 0xffffffff) {
          uVar21 = (uint)uVar5;
        }
        pvVar6 = s->f[lVar25];
        lVar19 = (long)s->max_topn;
        iVar36 = s->veclen[lVar25];
        iVar29 = 0;
        if (0 < iVar36) {
          iVar29 = iVar36;
        }
        uVar35 = 0;
LAB_00118bef:
        if (uVar35 != uVar21) {
          bVar2 = pkVar20->bbi[uVar35];
          lVar34 = (long)(int)(iVar36 * (uint)bVar2);
          mVar38 = s->dets[lVar25][bVar2];
          for (lVar31 = 0; iVar29 != (int)lVar31; lVar31 = lVar31 + 1) {
            if ((float)mVar38 < (float)pvVar6[lVar19 + -1].score) goto LAB_00118cc0;
            fVar39 = (float)feat[lVar31] - (float)s->means[lVar25][lVar34 + lVar31];
            mVar38 = (mfcc_t)((float)mVar38 -
                             fVar39 * fVar39 * (float)s->vars[lVar25][lVar34 + lVar31]);
          }
          iVar26 = (int)(float)mVar38;
          if (pvVar6[lVar19 + -1].score <= iVar26) {
            uVar4 = s->max_topn;
            if ((short)uVar4 < 1) {
              uVar4 = 0;
            }
            uVar33 = 0;
            do {
              pvVar30 = pvVar6 + lVar19 + -2;
              if (uVar4 == uVar33) goto LAB_00118ca1;
              pvVar30 = pvVar6 + uVar33;
              uVar33 = uVar33 + 1;
            } while (pvVar30->codeword != (uint)bVar2);
          }
          goto LAB_00118cc0;
        }
      }
LAB_00118aa2:
      pvVar6 = s->f[lVar25];
      iVar36 = pvVar6->score;
      for (lVar19 = 0; lVar19 < s->max_topn; lVar19 = lVar19 + 1) {
        iVar29 = (iVar36 >> 10) - (pvVar6[lVar19].score >> 10);
        if (0x5f < iVar29) {
          iVar29 = 0x60;
        }
        pvVar6[lVar19].score = iVar29;
        if ((s->topn_beam[lVar25] != 0) && ((int)(uint)s->topn_beam[lVar25] < iVar29)) break;
      }
      s->topn_hist_n[lVar22][lVar25] = (uint8)lVar19;
    }
    bVar2 = s->topn_hist_n[lVar22][lVar25];
    piVar8 = ascr->senscr;
    puVar9 = ascr->sen_active;
    switch(bVar2) {
    case 1:
      pvVar6 = s->f[lVar25];
      puVar11 = s->mixw[lVar25][pvVar6->codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          piVar8[lVar19] = piVar8[lVar19] + ((uint)puVar11[lVar19] + pvVar6->score) * -0x400;
        }
      }
      break;
    case 2:
      pvVar6 = s->f[lVar25];
      puVar11 = s->mixw[lVar25][pvVar6->codeword];
      puVar12 = s->mixw[lVar25][pvVar6[1].codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          iVar29 = (uint)puVar11[lVar19] + pvVar6->score;
          iVar36 = (uint)puVar12[lVar19] + pvVar6[1].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          piVar8[lVar19] =
               piVar8[lVar19] +
               ((uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar21) - iVar36) * 0x400;
        }
      }
      break;
    case 3:
      ppuVar10 = s->mixw[lVar25];
      pvVar6 = s->f[lVar25];
      puVar11 = ppuVar10[pvVar6->codeword];
      puVar12 = ppuVar10[pvVar6[1].codeword];
      puVar13 = ppuVar10[pvVar6[2].codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          iVar29 = (uint)puVar11[lVar19] + pvVar6->score;
          iVar36 = (uint)puVar12[lVar19] + pvVar6[1].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          pvVar17 = (s->lmath_8b->t).table;
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar13[lVar19] + pvVar6[2].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          piVar8[lVar19] =
               piVar8[lVar19] + ((uint)*(byte *)((long)pvVar17 + (ulong)uVar21) - iVar29) * 0x400;
        }
      }
      break;
    case 4:
      ppuVar10 = s->mixw[lVar25];
      pvVar6 = s->f[lVar25];
      puVar11 = ppuVar10[pvVar6->codeword];
      puVar12 = ppuVar10[pvVar6[1].codeword];
      puVar13 = ppuVar10[pvVar6[2].codeword];
      puVar14 = ppuVar10[pvVar6[3].codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          iVar29 = (uint)puVar11[lVar19] + pvVar6->score;
          iVar36 = (uint)puVar12[lVar19] + pvVar6[1].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          pvVar17 = (s->lmath_8b->t).table;
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar13[lVar19] + pvVar6[2].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar29 = iVar29 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar36 = (uint)puVar14[lVar19] + pvVar6[3].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          piVar8[lVar19] =
               piVar8[lVar19] + ((uint)*(byte *)((long)pvVar17 + (ulong)uVar21) - iVar36) * 0x400;
        }
      }
      break;
    case 5:
      ppuVar10 = s->mixw[lVar25];
      pvVar6 = s->f[lVar25];
      puVar11 = ppuVar10[pvVar6->codeword];
      puVar12 = ppuVar10[pvVar6[1].codeword];
      puVar13 = ppuVar10[pvVar6[2].codeword];
      puVar14 = ppuVar10[pvVar6[3].codeword];
      puVar15 = ppuVar10[pvVar6[4].codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          iVar29 = (uint)puVar11[lVar19] + pvVar6->score;
          iVar36 = (uint)puVar12[lVar19] + pvVar6[1].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          pvVar17 = (s->lmath_8b->t).table;
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar13[lVar19] + pvVar6[2].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar29 = iVar29 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar36 = (uint)puVar14[lVar19] + pvVar6[3].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar15[lVar19] + pvVar6[4].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          piVar8[lVar19] =
               piVar8[lVar19] + ((uint)*(byte *)((long)pvVar17 + (ulong)uVar21) - iVar29) * 0x400;
        }
      }
      break;
    case 6:
      ppuVar10 = s->mixw[lVar25];
      pvVar6 = s->f[lVar25];
      puVar11 = ppuVar10[pvVar6->codeword];
      puVar12 = ppuVar10[pvVar6[1].codeword];
      puVar13 = ppuVar10[pvVar6[2].codeword];
      puVar14 = ppuVar10[pvVar6[3].codeword];
      puVar15 = ppuVar10[pvVar6[4].codeword];
      puVar16 = ppuVar10[pvVar6[5].codeword];
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          iVar29 = (uint)puVar11[lVar19] + pvVar6->score;
          iVar36 = (uint)puVar12[lVar19] + pvVar6[1].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          pvVar17 = (s->lmath_8b->t).table;
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar13[lVar19] + pvVar6[2].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar29 = iVar29 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar36 = (uint)puVar14[lVar19] + pvVar6[3].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar36 = iVar36 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar29 = (uint)puVar15[lVar19] + pvVar6[4].score;
          uVar27 = iVar36 - iVar29;
          if (iVar36 < iVar29) {
            iVar29 = iVar36;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          iVar29 = iVar29 - (uint)*(byte *)((long)pvVar17 + (ulong)uVar21);
          iVar36 = (uint)puVar16[lVar19] + pvVar6[5].score;
          uVar27 = iVar29 - iVar36;
          if (iVar29 < iVar36) {
            iVar36 = iVar29;
          }
          uVar21 = -uVar27;
          if (0 < (int)uVar27) {
            uVar21 = uVar27;
          }
          piVar8[lVar19] =
               piVar8[lVar19] + ((uint)*(byte *)((long)pvVar17 + (ulong)uVar21) - iVar36) * 0x400;
        }
      }
      break;
    default:
      for (lVar19 = 0; lVar19 < s->n_sen; lVar19 = lVar19 + 1) {
        if (puVar9[lVar19] != '\0') {
          pvVar6 = s->f[lVar25];
          iVar36 = (uint)s->mixw[lVar25][pvVar6->codeword][lVar19] + pvVar6->score;
          for (uVar35 = 1; uVar35 < bVar2; uVar35 = uVar35 + 1) {
            iVar29 = (uint)s->mixw[lVar25][pvVar6[uVar35].codeword][lVar19] + pvVar6[uVar35].score;
            uVar27 = iVar36 - iVar29;
            if (iVar36 < iVar29) {
              iVar29 = iVar36;
            }
            uVar21 = -uVar27;
            if (0 < (int)uVar27) {
              uVar21 = uVar27;
            }
            iVar36 = iVar29 - (uint)*(byte *)((long)(s->lmath_8b->t).table + (ulong)uVar21);
          }
          piVar8[lVar19] = piVar8[lVar19] + iVar36 * -0x400;
        }
      }
    }
    lVar25 = lVar25 + 1;
  } while( true );
LAB_001192d7:
  for (; (pvVar6 <= pvVar30 && (pvVar30->score <= iVar36)); pvVar30 = pvVar30 + -1) {
    pvVar30[1] = *pvVar30;
  }
  pvVar30[1].codeword = iVar29;
  pvVar30[1].score = iVar36;
LAB_001192f4:
  pmVar24 = pmVar24 + 1;
  pmVar37 = pmVar32;
  goto LAB_00119222;
LAB_00118ca1:
  for (; (pvVar6 <= pvVar30 && (pvVar30->score <= iVar26)); pvVar30 = pvVar30 + -1) {
    pvVar30[1] = *pvVar30;
  }
  pvVar30[1].codeword = (uint)bVar2;
  pvVar30[1].score = iVar26;
LAB_00118cc0:
  uVar35 = uVar35 + 1;
  goto LAB_00118bef;
}

Assistant:

int
s2_semi_mgau_frame_eval(s2_semi_mgau_t *s,
                        ascr_t *ascr,
                        fast_gmm_t *fgmm,
                        mfcc_t **featbuf,
                        int32 frame)
{
    int i, topn_idx;

    memset(ascr->senscr, 0, s->n_sen * sizeof(*ascr->senscr));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < s->n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= s->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i],
                           ascr->senscr, ascr->sen_active);
    }

    return 0;
}